

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::CSVReaderOptions
          (CSVReaderOptions *this,CSVOption<char> single_byte_delimiter,
          CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *multi_byte_delimiter)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_> __l_01;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_bool>_> __l_02;
  allocator_type local_232;
  less<duckdb::LogicalTypeId> local_231;
  string *local_230;
  vector<duckdb::LogicalType,_true> *local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_220;
  string value;
  LogicalType local_1d8;
  LogicalType local_1c0;
  undefined1 local_1a8 [72];
  undefined1 local_160 [24];
  LogicalType local_148;
  LogicalType local_130;
  LogicalType local_118;
  LogicalType local_100;
  LogicalType local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Value local_70;
  
  DialectOptions::DialectOptions(&this->dialect_options);
  (this->ignore_errors).set_by_user = false;
  (this->ignore_errors).value = false;
  (this->store_rejects).set_by_user = false;
  (this->store_rejects).value = false;
  ::std::__cxx11::string::string((string *)&local_90,"reject_errors",(allocator *)local_1a8);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption(&this->rejects_table_name,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::string((string *)&local_b0,"reject_scans",(allocator *)local_1a8);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption(&this->rejects_scan_name,&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  this->rejects_limit = 0;
  this->buffer_sample_size = 0x19000;
  ::std::__cxx11::string::string((string *)local_1a8,anon_var_dwarf_4b4b1b2 + 9,(allocator *)&value)
  ;
  __l._M_len = 1;
  __l._M_array = (iterator)local_1a8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->null_str,__l,(allocator_type *)&local_70);
  local_220 = &this->null_str;
  ::std::__cxx11::string::~string((string *)local_1a8);
  this->compression = AUTO_DETECT;
  this->allow_quoted_nulls = true;
  this->comment = '\0';
  this->thousands_separator = '\0';
  (this->sql_types_per_column)._M_h._M_buckets = &(this->sql_types_per_column)._M_h._M_single_bucket
  ;
  (this->sql_types_per_column)._M_h._M_bucket_count = 1;
  (this->sql_types_per_column)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sql_types_per_column)._M_h._M_element_count = 0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sql_types_per_column)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->columns_set = false;
  LogicalType::LogicalType((LogicalType *)local_1a8,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_1a8 + 0x18),DOUBLE);
  LogicalType::LogicalType((LogicalType *)(local_1a8 + 0x30),BIGINT);
  LogicalType::LogicalType((LogicalType *)local_160,TIMESTAMP_TZ);
  LogicalType::LogicalType(&local_148,TIMESTAMP);
  LogicalType::LogicalType(&local_130,DATE);
  LogicalType::LogicalType(&local_118,TIME);
  LogicalType::LogicalType(&local_100,BOOLEAN);
  LogicalType::LogicalType(&local_e8,SQLNULL);
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)local_1a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&(this->auto_type_candidates).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__l_00,
             (allocator_type *)&value);
  lVar2 = 0xc0;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1a8 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  (this->sniffer_user_mismatch_error)._M_dataplus._M_p =
       (pointer)&(this->sniffer_user_mismatch_error).field_2;
  (this->sniffer_user_mismatch_error)._M_string_length = 0;
  (this->sniffer_user_mismatch_error).field_2._M_local_buf[0] = '\0';
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->maximum_line_size).set_by_user = false;
  (this->maximum_line_size).value = 2000000;
  this->normalize_names = false;
  (this->force_not_null_names)._M_h._M_buckets = &(this->force_not_null_names)._M_h._M_single_bucket
  ;
  (this->force_not_null_names)._M_h._M_bucket_count = 1;
  (this->force_not_null_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->force_not_null_names)._M_h._M_element_count = 0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->force_not_null_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->force_not_null_names)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)
   ((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 4) = 0;
  this->sample_size_chunks = 10;
  this->all_varchar = false;
  this->auto_detect = true;
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  (this->buffer_size_option).set_by_user = false;
  (this->buffer_size_option).value = 32000000;
  local_230 = &this->decimal_separator;
  local_228 = &this->auto_type_candidates;
  ::std::__cxx11::string::string((string *)local_230,".",(allocator *)local_1a8);
  this->null_padding = false;
  this->parallel = true;
  ::std::__cxx11::string::string((string *)&this->encoding,"utf-8",(allocator *)local_1a8);
  p_Var1 = &(this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->suffix)._M_dataplus._M_p = (pointer)&(this->suffix).field_2;
  (this->suffix)._M_string_length = 0;
  (this->suffix).field_2._M_local_buf[0] = '\0';
  (this->write_newline)._M_dataplus._M_p = (pointer)&(this->write_newline).field_2;
  (this->write_newline)._M_string_length = 0;
  (this->write_newline).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_1c0,SQLNULL);
  Value::Value((Value *)&value,&local_1c0);
  local_1a8[0] = DATE;
  Value::Value((Value *)(local_1a8 + 8),(Value *)&value);
  LogicalType::LogicalType(&local_1d8,SQLNULL);
  Value::Value(&local_70,&local_1d8);
  local_160[0] = TIMESTAMP;
  Value::Value((Value *)(local_160 + 8),&local_70);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1a8;
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::map(&this->write_date_format,__l_01,&local_231,&local_232);
  lVar2 = 0x50;
  do {
    Value::~Value((Value *)(local_1a8 + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x40);
  Value::~Value(&local_70);
  LogicalType::~LogicalType(&local_1d8);
  Value::~Value((Value *)&value);
  LogicalType::~LogicalType(&local_1c0);
  local_1a8._0_4_ = 0x13000f;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1a8;
  ::std::
  map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::map(&this->has_format,__l_02,(less<duckdb::LogicalTypeId> *)&value,(allocator_type *)&local_70);
  this->multi_file_reader = false;
  if ((multi_byte_delimiter->value)._M_string_length == 0) {
    value._M_dataplus._M_p = (pointer)&value.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&value,'\x01');
    ::std::__cxx11::string::string((string *)&local_d0,(string *)&value);
    CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    CSVOption((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1a8,&local_d0);
    CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,(CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1a8);
    ::std::__cxx11::string::~string((string *)(local_1a8 + 8));
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&value);
  }
  else {
    CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,multi_byte_delimiter);
  }
  return;
}

Assistant:

CSVReaderOptions::CSVReaderOptions(const CSVOption<char> single_byte_delimiter,
                                   const CSVOption<string> &multi_byte_delimiter) {
	if (multi_byte_delimiter.GetValue().empty()) {
		const char single_byte_value = single_byte_delimiter.GetValue();
		const string value(1, single_byte_value);
		dialect_options.state_machine_options.delimiter = value;
	} else {
		dialect_options.state_machine_options.delimiter = multi_byte_delimiter;
	}
}